

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O0

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  pointer *this;
  cmMakefile *this_00;
  PolicyStatus PVar1;
  TargetType TVar2;
  ostream *poVar3;
  string *psVar4;
  reference __lhs;
  cmLinkInterfaceLibraries *this_01;
  ulong uVar5;
  cmLinkImplementation *pcVar6;
  bool bVar7;
  string_view sVar8;
  cmLinkImplementation *li;
  basic_string_view<char,_std::char_traits<char>_> local_420;
  string local_410;
  string_view local_3f0;
  undefined1 local_3e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkFlagsList;
  string *i;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  string end;
  undefined1 local_378 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeList;
  string includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string_view local_300;
  string_view local_2f0;
  bool local_2d9;
  undefined1 local_2d8 [7];
  bool relpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string *local_298;
  string *lib;
  cmGeneratorTarget *gt;
  cmLinkItem *item;
  const_iterator __end5;
  const_iterator __begin5;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range5;
  cmLinkInterfaceLibraries *linkIFace;
  string ldlibs;
  string sharedLibs;
  string staticLibs;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *property;
  const_iterator __end2;
  const_iterator __begin2;
  ImportPropertyMap *__range2;
  undefined1 local_1b0 [8];
  ostringstream w;
  bool newCMP0022Behavior;
  string *config_local;
  GenerateType type_local;
  ImportPropertyMap *properties_local;
  ostream *os_local;
  cmGeneratorTarget *target_local;
  
  PVar1 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
  bVar7 = false;
  if (PVar1 != WARN) {
    PVar1 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
    bVar7 = PVar1 != OLD;
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    if (type == BUILD) {
      std::operator<<((ostream *)local_1b0,
                      "export(TARGETS ... ANDROID_MK) called with policy CMP0022");
    }
    else {
      std::operator<<((ostream *)local_1b0,
                      "install( EXPORT_ANDROID_MK ...) called with policy CMP0022");
    }
    poVar3 = std::operator<<((ostream *)local_1b0," set to OLD for target ");
    psVar4 = cmTarget::GetName_abi_cxx11_(target->Target);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,". ");
    std::operator<<(poVar3,"The export will only work with CMP0022 set to NEW.");
    this_00 = target->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  }
  bVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(properties);
  if (!bVar7) {
    std::operator<<(os,"LOCAL_CPP_FEATURES := rtti exceptions\n");
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(properties);
    property = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(properties);
    while( true ) {
      bVar7 = std::operator!=(&__end2,(_Self *)&property);
      if (!bVar7) break;
      __lhs = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*(&__end2);
      bVar7 = std::operator==(&__lhs->first,"INTERFACE_COMPILE_OPTIONS");
      if (bVar7) {
        std::operator<<(os,"LOCAL_CPP_FEATURES += ");
        poVar3 = std::operator<<(os,(string *)&__lhs->second);
        std::operator<<(poVar3,"\n");
      }
      else {
        bVar7 = std::operator==(&__lhs->first,"INTERFACE_LINK_LIBRARIES");
        if (bVar7) {
          std::__cxx11::string::string((string *)(sharedLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(ldlibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&linkIFace);
          this_01 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,config,target,Link);
          __end5 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_01->Libraries);
          item = (cmLinkItem *)
                 std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_01->Libraries);
          while( true ) {
            bVar7 = __gnu_cxx::operator!=
                              (&__end5,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                        *)&item);
            if (!bVar7) break;
            gt = (cmGeneratorTarget *)
                 __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&__end5);
            lib = *(string **)&gt->ObjectDirectory;
            local_298 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)gt);
            if (lib == (string *)0x0) {
              local_2d9 = false;
              if (type == INSTALL) {
                sVar8 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_298);
                local_2f0 = sVar8;
                local_2d9 = cmHasLiteralPrefix<4ul>(sVar8,(char (*) [4])0xc09640);
              }
              bVar7 = cmsys::SystemTools::FileIsFullPath(local_298);
              if (!bVar7) {
                sVar8 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_298);
                local_300 = sVar8;
                bVar7 = cmHasLiteralPrefix<3ul>(sVar8,(char (*) [3])0xc463d4);
                if ((!bVar7) && ((local_2d9 & 1U) == 0)) {
                  uVar5 = std::__cxx11::string::empty();
                  if ((uVar5 & 1) == 0) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&includes.field_2 + 8)," -l",local_298);
                    std::__cxx11::string::operator+=
                              ((string *)&linkIFace,(string *)(includes.field_2._M_local_buf + 8));
                    std::__cxx11::string::~string((string *)(includes.field_2._M_local_buf + 8));
                  }
                  goto LAB_00617191;
                }
              }
              std::operator+(&local_320," ",local_298);
              std::__cxx11::string::operator+=((string *)&linkIFace,(string *)&local_320);
              std::__cxx11::string::~string((string *)&local_320);
            }
            else {
              TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lib);
              if (TVar2 != SHARED_LIBRARY) {
                TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lib);
                if (TVar2 != MODULE_LIBRARY) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2d8," ",local_298);
                  std::__cxx11::string::operator+=
                            ((string *)(sharedLibs.field_2._M_local_buf + 8),(string *)local_2d8);
                  std::__cxx11::string::~string((string *)local_2d8);
                  goto LAB_00617191;
                }
              }
              std::operator+(&local_2b8," ",local_298);
              std::__cxx11::string::operator+=
                        ((string *)(ldlibs.field_2._M_local_buf + 8),(string *)&local_2b8);
              std::__cxx11::string::~string((string *)&local_2b8);
            }
LAB_00617191:
            __gnu_cxx::
            __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
            ::operator++(&__end5);
          }
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            poVar3 = std::operator<<(os,"LOCAL_SHARED_LIBRARIES :=");
            poVar3 = std::operator<<(poVar3,(string *)(ldlibs.field_2._M_local_buf + 8));
            std::operator<<(poVar3,"\n");
          }
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            poVar3 = std::operator<<(os,"LOCAL_STATIC_LIBRARIES :=");
            poVar3 = std::operator<<(poVar3,(string *)(sharedLibs.field_2._M_local_buf + 8));
            std::operator<<(poVar3,"\n");
          }
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            poVar3 = std::operator<<(os,"LOCAL_EXPORT_LDLIBS :=");
            poVar3 = std::operator<<(poVar3,(string *)&linkIFace);
            std::operator<<(poVar3,"\n");
          }
          std::__cxx11::string::~string((string *)&linkIFace);
          std::__cxx11::string::~string((string *)(ldlibs.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(sharedLibs.field_2._M_local_buf + 8));
        }
        else {
          bVar7 = std::operator==(&__lhs->first,"INTERFACE_INCLUDE_DIRECTORIES");
          if (bVar7) {
            this = &includeList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::string((string *)this,(string *)&__lhs->second);
            sVar8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
            end.field_2._8_8_ = sVar8._M_len;
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_378,sVar8,false);
            std::operator<<(os,"LOCAL_EXPORT_C_INCLUDES := ");
            std::__cxx11::string::string((string *)&__range6);
            __end6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_378);
            i = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_378);
            while( true ) {
              bVar7 = __gnu_cxx::operator!=
                                (&__end6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&i);
              if (!bVar7) break;
              linkFlagsList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end6);
              poVar3 = std::operator<<(os,(string *)&__range6);
              std::operator<<(poVar3,(string *)
                                     linkFlagsList.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator=((string *)&__range6,"\\\n");
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end6);
            }
            std::operator<<(os,"\n");
            std::__cxx11::string::~string((string *)&__range6);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_378);
            std::__cxx11::string::~string
                      ((string *)
                       &includeList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            bVar7 = std::operator==(&__lhs->first,"INTERFACE_LINK_OPTIONS");
            if (bVar7) {
              std::operator<<(os,"LOCAL_EXPORT_LDFLAGS := ");
              sVar8 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&__lhs->second);
              local_3f0 = sVar8;
              cmExpandedList_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3e0,sVar8,false);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_420," ");
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&li);
              sVar8._M_str = local_420._M_str;
              sVar8._M_len = local_420._M_len;
              cmJoin(&local_410,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e0,sVar8,_li);
              poVar3 = std::operator<<(os,(string *)&local_410);
              std::operator<<(poVar3,"\n");
              std::__cxx11::string::~string((string *)&local_410);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3e0);
            }
            else {
              poVar3 = std::operator<<(os,"# ");
              poVar3 = std::operator<<(poVar3,(string *)__lhs);
              poVar3 = std::operator<<(poVar3," ");
              poVar3 = std::operator<<(poVar3,(string *)&__lhs->second);
              std::operator<<(poVar3,"\n");
            }
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
  }
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == STATIC_LIBRARY) {
    pcVar6 = cmGeneratorTarget::GetLinkImplementation(target,config,Link);
    bVar7 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[4],_0>
                      (&pcVar6->Languages,(char (*) [4])0xc095ac);
    if (bVar7) {
      std::operator<<(os,"LOCAL_HAS_CPP := true\n");
    }
  }
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != EXECUTABLE) {
    if (TVar2 == STATIC_LIBRARY) {
      std::operator<<(os,"include $(PREBUILT_STATIC_LIBRARY)\n");
    }
    else if (TVar2 - SHARED_LIBRARY < 2) {
      std::operator<<(os,"include $(PREBUILT_SHARED_LIBRARY)\n");
    }
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (auto const& property : properties) {
      if (property.first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (property.second) << "\n";
      } else if (property.first == "INTERFACE_LINK_LIBRARIES") {
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        cmLinkInterfaceLibraries const* linkIFace =
          target->GetLinkInterfaceLibraries(
            config, target, cmGeneratorTarget::LinkInterfaceFor::Link);
        for (cmLinkItem const& item : linkIFace->Libraries) {
          cmGeneratorTarget const* gt = item.Target;
          std::string const& lib = item.AsStr();
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + lib;
            } else {
              staticLibs += " " + lib;
            }
          } else {
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = cmHasLiteralPrefix(lib, "../");
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(lib) ||
                cmHasLiteralPrefix(lib, "-l") || relpath) {
              ldlibs += " " + lib;
              // if it is not a path and does not have a -l then add -l
            } else if (!lib.empty()) {
              ldlibs += " -l" + lib;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (property.first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = property.second;
        std::vector<std::string> includeList = cmExpandedList(includes);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::string const& i : includeList) {
          os << end << i;
          end = "\\\n";
        }
        os << "\n";
      } else if (property.first == "INTERFACE_LINK_OPTIONS") {
        os << "LOCAL_EXPORT_LDFLAGS := ";
        std::vector<std::string> linkFlagsList =
          cmExpandedList(property.second);
        os << cmJoin(linkFlagsList, " ") << "\n";
      } else {
        os << "# " << property.first << " " << (property.second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(
      config, cmGeneratorTarget::LinkInterfaceFor::Link);
    if (cm::contains(li->Languages, "CXX")) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}